

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O2

void __thiscall glslang::TSmallArrayVector::setDimSize(TSmallArrayVector *this,int i,uint size)

{
  TVector<glslang::TArraySize> *pTVar1;
  pointer pTVar2;
  
  pTVar1 = this->sizes;
  if ((pTVar1 != (TVector<glslang::TArraySize> *)0x0) &&
     (pTVar2 = (pTVar1->
               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
               ._M_impl.super__Vector_impl_data._M_start,
     i < (int)((ulong)((long)(pTVar1->
                             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ).
                             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) >> 4))) {
    if (pTVar2[i].node == (TIntermTyped *)0x0) {
      pTVar2[i].size = size;
      return;
    }
    __assert_fail("(*sizes)[i].node == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                  ,0xb5,"void glslang::TSmallArrayVector::setDimSize(int, unsigned int) const");
  }
  __assert_fail("sizes != nullptr && (int)sizes->size() > i",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                ,0xb4,"void glslang::TSmallArrayVector::setDimSize(int, unsigned int) const");
}

Assistant:

void setDimSize(int i, unsigned int size) const
    {
        assert(sizes != nullptr && (int)sizes->size() > i);
        assert((*sizes)[i].node == nullptr);
        (*sizes)[i].size = size;
    }